

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fScissorTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::ScissorTests::init(ScissorTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestContext *testCtx;
  RenderContext *renderCtx;
  int extraout_EAX;
  TestNode *pTVar2;
  float *renderArea;
  long lVar3;
  bool bVar4;
  Vec4 local_348;
  char *local_338;
  char *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318 [6];
  char *local_300;
  char *local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  char *local_290;
  char *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  char *local_258;
  char *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  char *local_220;
  char *local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  char *local_178;
  char *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  char *local_140;
  char *local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  char *local_108;
  char *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  char *local_d0;
  char *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  char *local_98;
  char *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  char *local_60;
  char *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  testCtx = pCVar1->m_testCtx;
  renderCtx = pCVar1->m_renderCtx;
  renderArea = local_318;
  local_338 = "contained_tris";
  local_330 = "Triangles fully inside scissor area (single call)";
  local_328 = 0x3dcccccd3dcccccd;
  uStack_320 = 0x3f4ccccd3f4ccccd;
  local_318[0] = 0.2;
  local_318[1] = 0.2;
  local_318[2] = 0.6;
  local_318[3] = 0.6;
  local_318[4] = 2.8026e-45;
  local_318[5] = 4.2039e-44;
  local_300 = "partial_tris";
  local_2f8 = "Triangles partially inside scissor area (single call)";
  local_2f0 = 0x3e99999a3e99999a;
  uStack_2e8 = 0x3ecccccd3ecccccd;
  local_2e0 = 0x3e4ccccd3e4ccccd;
  uStack_2d8 = 0x3f19999a3f19999a;
  local_2d0 = 0x1e00000002;
  local_2c8 = "contained_tri";
  local_2c0 = "Triangle fully inside scissor area";
  local_2b8 = 0x3dcccccd3dcccccd;
  uStack_2b0 = 0x3f4ccccd3f4ccccd;
  local_2a8 = 0x3e4ccccd3e4ccccd;
  uStack_2a0 = 0x3f19999a3f19999a;
  local_298 = 0x100000002;
  local_290 = "enclosing_tri";
  local_288 = "Triangle fully covering scissor area";
  local_280 = 0x3ecccccd3ecccccd;
  uStack_278 = 0x3e4ccccd3e4ccccd;
  local_270 = 0x3e4ccccd3e4ccccd;
  uStack_268 = 0x3f19999a3f19999a;
  local_260 = 0x100000002;
  local_258 = "partial_tri";
  local_250 = "Triangle partially inside scissor area";
  local_248 = 0x3ecccccd3ecccccd;
  uStack_240 = 0x3f19999a3f19999a;
  local_238 = 0;
  uStack_230 = 0x3f8000003f800000;
  local_228 = 0x100000002;
  local_220 = "outside_render_tri";
  local_218 = "Triangle with scissor area outside render target";
  local_210 = 0x3fb333333fb33333;
  uStack_208 = 0x3f19999a3f19999a;
  local_200 = 0;
  uStack_1f8 = 0x3f19999a3f19999a;
  local_1f0 = 0x100000002;
  local_1e8 = "partial_lines";
  local_1e0 = "Linse partially inside scissor area";
  local_1d8 = 0x3ecccccd3ecccccd;
  uStack_1d0 = 0x3f19999a3f19999a;
  local_1c8 = 0;
  uStack_1c0 = 0x3f8000003f800000;
  local_1b8 = 0x1e00000001;
  local_1b0 = "contained_line";
  local_1a8 = "Line fully inside scissor area";
  local_1a0 = 0x3dcccccd3dcccccd;
  uStack_198 = 0x3f4ccccd3f4ccccd;
  local_190 = 0x3e4ccccd3e4ccccd;
  uStack_188 = 0x3f19999a3f19999a;
  local_180 = 0x100000001;
  local_178 = "partial_line";
  local_170 = "Line partially inside scissor area";
  local_168 = 0x3ecccccd3ecccccd;
  uStack_160 = 0x3f19999a3f19999a;
  local_158 = 0;
  uStack_150 = 0x3f8000003f800000;
  local_148 = 0x100000001;
  local_140 = "outside_render_line";
  local_138 = "Line with scissor area outside render target";
  local_130 = 0x3fb333333fb33333;
  uStack_128 = 0x3f19999a3f19999a;
  local_120 = 0;
  uStack_118 = 0x3f19999a3f19999a;
  local_110 = 0x100000001;
  local_108 = "contained_point";
  local_100 = "Point fully inside scissor area";
  local_f8 = 0x3dcccccd3dcccccd;
  uStack_f0 = 0x3f4ccccd3f4ccccd;
  local_e8 = 0x3f0000003f000000;
  uStack_e0 = 0;
  local_d8 = 0x100000000;
  local_d0 = "partial_points";
  local_c8 = "Points partially inside scissor area";
  local_c0 = 0x3ecccccd3ecccccd;
  uStack_b8 = 0x3f19999a3f19999a;
  local_b0 = 0;
  uStack_a8 = 0x3f8000003f800000;
  local_a0 = 0x1e00000000;
  local_98 = "outside_point";
  local_90 = "Point fully outside scissor area";
  local_88 = 0x3ecccccd3ecccccd;
  uStack_80 = 0x3f19999a3f19999a;
  local_68 = 0x100000000;
  local_78 = 0;
  uStack_70 = 0;
  local_60 = "outside_render_point";
  local_58 = "Point with scissor area outside render target";
  local_50 = 0x3fb333333fb33333;
  uStack_48 = 0x3f19999a3f19999a;
  local_40 = 0x3f0000003f000000;
  uStack_38 = 0;
  local_30 = 0x100000000;
  lVar3 = 0xe;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    pTVar2 = deqp::gls::Functional::ScissorTestInternal::createPrimitiveTest
                       (testCtx,renderCtx,*(char **)((Vec4 *)(renderArea + -8))->m_data,
                        *(char **)(renderArea + -6),(Vec4 *)(renderArea + -4),(Vec4 *)renderArea,
                        (PrimitiveType)((Vec4 *)(renderArea + 4))->m_data[0],(int)renderArea[5]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    renderArea = renderArea + 0xe;
  }
  local_348.m_data[0] = 0.1;
  local_348.m_data[1] = 0.1;
  local_348.m_data[2] = 0.8;
  local_348.m_data[3] = 0.8;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_depth","Depth buffer clear",&local_348,0x100);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_348.m_data[0] = 0.1;
  local_348.m_data[1] = 0.1;
  local_348.m_data[2] = 0.8;
  local_348.m_data[3] = 0.8;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_stencil","Stencil buffer clear",&local_348,0x400);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_348.m_data[0] = 0.1;
  local_348.m_data[1] = 0.1;
  local_348.m_data[2] = 0.8;
  local_348.m_data[3] = 0.8;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_color","Color buffer clear",&local_348,0x4000);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void ScissorTests::init (void)
{
	using tcu::Vec4;
	using namespace gls::Functional::ScissorTestInternal;

	tcu::TestContext&		tc = m_context.getTestContext();
	glu::RenderContext&		rc = m_context.getRenderContext();

	const struct
	{
		const char*		name;
		const char*		desc;
		const tcu::Vec4	scissor;
		const tcu::Vec4	render;
		PrimitiveType	type;
		const int		primitives;
	} cases[] =
	{
		{ "contained_tris",			"Triangles fully inside scissor area (single call)",		Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	30 },
		{ "partial_tris",			"Triangles partially inside scissor area (single call)",	Vec4(0.3f, 0.3f, 0.4f, 0.4f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	30 },
		{ "contained_tri",			"Triangle fully inside scissor area",						Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "enclosing_tri",			"Triangle fully covering scissor area",						Vec4(0.4f, 0.4f, 0.2f, 0.2f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "partial_tri",			"Triangle partially inside scissor area",					Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), TRIANGLE,	1  },
		{ "outside_render_tri",		"Triangle with scissor area outside render target",			Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "partial_lines",			"Linse partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), LINE,		30 },
		{ "contained_line",			"Line fully inside scissor area",							Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), LINE,		1  },
		{ "partial_line",			"Line partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), LINE,		1  },
		{ "outside_render_line",	"Line with scissor area outside render target",				Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.6f, 0.6f), LINE,		1  },
		{ "contained_point",		"Point fully inside scissor area",							Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.5f, 0.5f, 0.0f, 0.0f), POINT,		1  },
		{ "partial_points",			"Points partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), POINT,		30 },
		{ "outside_point",			"Point fully outside scissor area",							Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.0f, 0.0f), POINT,		1  },
		{ "outside_render_point",	"Point with scissor area outside render target",			Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.5f, 0.5f, 0.0f, 0.0f),	POINT,		1  }
	};

	for(int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		addChild(createPrimitiveTest(tc,
									 rc,
									 cases[caseNdx].name,
									 cases[caseNdx].desc,
									 cases[caseNdx].scissor,
									 cases[caseNdx].render,
									 cases[caseNdx].type,
									 cases[caseNdx].primitives));
	}

	addChild(createClearTest(tc, rc, "clear_depth",		"Depth buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_DEPTH_BUFFER_BIT));
	addChild(createClearTest(tc, rc, "clear_stencil",	"Stencil buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_STENCIL_BUFFER_BIT));
	addChild(createClearTest(tc, rc, "clear_color",		"Color buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_COLOR_BUFFER_BIT));
}